

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix-top.c
# Opt level: O0

void process_event(helix_session_t session,helix_event_t event)

{
  helix_event_mask_t hVar1;
  helix_event_mask_t mask;
  helix_event_t in_stack_00000060;
  
  hVar1 = helix_event_mask((helix_event_t)0x134b08);
  if ((hVar1 & HELIX_EVENT_ORDER_BOOK_UPDATE) != 0) {
    print_top(in_stack_00000060);
  }
  return;
}

Assistant:

static void process_event(helix_session_t session, helix_event_t event)
{
	helix_event_mask_t mask = helix_event_mask(event);

	if (mask & HELIX_EVENT_ORDER_BOOK_UPDATE) {
		print_top(event);
	}
}